

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O1

void Cbs2_ObjDeleteFanout(Cbs2_Man_t *p,int iObj)

{
  uint uVar1;
  int *piVar2;
  uint uVar3;
  
  if (iObj < 0) {
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  uVar3 = iObj * 2;
  uVar1 = (p->vFanoutN).nSize;
  if (uVar1 != uVar3 && SBORROW4(uVar1,uVar3) == (int)(uVar1 + iObj * -2) < 0) {
    piVar2 = (p->vFanoutN).pArray;
    piVar2[uVar3] = 0;
    if (((int)(uVar3 | 1) < (p->vFanoutN).nSize) &&
       (piVar2[uVar3 | 1] = 0, iObj < (p->vFanout0).nSize)) {
      (p->vFanout0).pArray[(uint)iObj] = 0;
      return;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
}

Assistant:

void Cbs2_ObjDeleteFanout( Cbs2_Man_t * p, int iObj )
{
    Vec_IntWriteEntry( &p->vFanoutN, Abc_Var2Lit(iObj, 0), 0 );
    Vec_IntWriteEntry( &p->vFanoutN, Abc_Var2Lit(iObj, 1), 0 );
    Vec_IntWriteEntry( &p->vFanout0, iObj, 0 );
}